

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMin
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *this_00;
  bool bVar1;
  int iVar2;
  type_conflict5 tVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  pointer pBVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  pointer pBVar13;
  byte bVar14;
  int local_3dc;
  int *local_3d8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  int *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  cpp_dec_float<200U,_int,_void> local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar14 = 0;
  local_3b8.m_backend.fpclass = cpp_dec_float_finite;
  local_3b8.m_backend.prec_elem = 0x1c;
  local_3b8.m_backend.data._M_elems[0] = 0;
  local_3b8.m_backend.data._M_elems[1] = 0;
  local_3b8.m_backend.data._M_elems[2] = 0;
  local_3b8.m_backend.data._M_elems[3] = 0;
  local_3b8.m_backend.data._M_elems[4] = 0;
  local_3b8.m_backend.data._M_elems[5] = 0;
  local_3b8.m_backend.data._M_elems[6] = 0;
  local_3b8.m_backend.data._M_elems[7] = 0;
  local_3b8.m_backend.data._M_elems[8] = 0;
  local_3b8.m_backend.data._M_elems[9] = 0;
  local_3b8.m_backend.data._M_elems[10] = 0;
  local_3b8.m_backend.data._M_elems[0xb] = 0;
  local_3b8.m_backend.data._M_elems[0xc] = 0;
  local_3b8.m_backend.data._M_elems[0xd] = 0;
  local_3b8.m_backend.data._M_elems[0xe] = 0;
  local_3b8.m_backend.data._M_elems[0xf] = 0;
  local_3b8.m_backend.data._M_elems[0x18] = 0;
  local_3b8.m_backend.data._M_elems[0x19] = 0;
  local_3b8.m_backend.data._M_elems._104_5_ = 0;
  local_3b8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_3b8.m_backend.exp = 0;
  local_3b8.m_backend.neg = false;
  local_3b8.m_backend.data._M_elems[0x10] = 0;
  local_3b8.m_backend.data._M_elems[0x11] = 0;
  local_3b8.m_backend.data._M_elems[0x12] = 0;
  local_3b8.m_backend.data._M_elems[0x13] = 0;
  local_3b8.m_backend.data._M_elems[0x14] = 0;
  local_3b8.m_backend.data._M_elems[0x15] = 0;
  local_3b8.m_backend.data._M_elems[0x16] = 0;
  local_3b8.m_backend.data._M_elems[0x17] = 0;
  local_3d8 = minIdx;
  local_3d0 = upd;
  if (*nBp == 0) {
    pdVar4 = (double *)infinity();
    pBVar13 = (pointer)&local_b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)pBVar13,*pdVar4,(type *)0x0);
  }
  else {
    pBVar13 = (this->breakpoints).data.
              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
              ._M_impl.super__Vector_impl_data._M_start + *minIdx;
    pBVar7 = pBVar13;
    pcVar9 = &local_b0;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pcVar9->data)._M_elems[0] = (pBVar7->val).m_backend.data._M_elems[0];
      pBVar7 = (pointer)((long)(pBVar7->val).m_backend.data._M_elems + 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((pcVar9->data)._M_elems + 1);
    }
  }
  iVar2 = *(int *)((long)&(pBVar13->val).m_backend + 0x70);
  bVar1 = *(bool *)((long)&(pBVar13->val).m_backend + 0x74);
  pcVar9 = &local_b0;
  pnVar11 = &local_130;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar11->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
    pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar11 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = iVar2;
  local_130.m_backend.neg = bVar1;
  local_130.m_backend._120_8_ = *(undefined8 *)((long)&(pBVar13->val).m_backend + 0x78);
  local_3c0 = idx + nnz;
  local_3c8 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon;
  pnVar11 = &(this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).fastDelta;
  this_00 = &this->breakpoints;
  do {
    pnVar10 = local_3c8;
    lVar5 = 0x1c;
    if (local_3c0 <= idx) {
      return;
    }
    iVar2 = *idx;
    pnVar8 = local_3d0 + iVar2;
    pcVar9 = &local_b0;
    for (lVar6 = lVar5; lVar6 != 0; lVar6 = lVar6 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar9->data)->data)._M_elems[0] =
           (pnVar8->m_backend).data._M_elems[0];
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + ((ulong)bVar14 * -2 + 1) * 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_b0.exp = local_3d0[iVar2].m_backend.exp;
    local_b0.neg = local_3d0[iVar2].m_backend.neg;
    local_b0.fpclass = local_3d0[iVar2].m_backend.fpclass;
    local_b0.prec_elem = local_3d0[iVar2].m_backend.prec_elem;
    pnVar8 = local_3c8;
    pcVar9 = &y.m_backend;
    for (lVar6 = lVar5; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pcVar9->data)._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
      pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar8 + (ulong)bVar14 * -8 + 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar14 * -8 + 4);
    }
    y.m_backend.exp =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.exp;
    y.m_backend.neg =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.neg;
    y.m_backend.fpclass =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.fpclass;
    y.m_backend.prec_elem =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.prec_elem;
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&y.m_backend);
    pcVar9 = &y.m_backend;
    if (tVar3) {
      pdVar4 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&y.m_backend,-*pdVar4,(type *)0x0);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&low[iVar2].m_backend,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&y.m_backend);
      if (tVar3) {
        y.m_backend.fpclass = cpp_dec_float_finite;
        y.m_backend.prec_elem = 0x1c;
        y.m_backend.data._M_elems[0] = 0;
        y.m_backend.data._M_elems[1] = 0;
        y.m_backend.data._M_elems[2] = 0;
        y.m_backend.data._M_elems[3] = 0;
        y.m_backend.data._M_elems[4] = 0;
        y.m_backend.data._M_elems[5] = 0;
        y.m_backend.data._M_elems[6] = 0;
        y.m_backend.data._M_elems[7] = 0;
        y.m_backend.data._M_elems[8] = 0;
        y.m_backend.data._M_elems[9] = 0;
        y.m_backend.data._M_elems[10] = 0;
        y.m_backend.data._M_elems[0xb] = 0;
        y.m_backend.data._M_elems[0xc] = 0;
        y.m_backend.data._M_elems[0xd] = 0;
        y.m_backend.data._M_elems[0xe] = 0;
        y.m_backend.data._M_elems[0xf] = 0;
        y.m_backend.data._M_elems[0x10] = 0;
        y.m_backend.data._M_elems[0x11] = 0;
        y.m_backend.data._M_elems[0x12] = 0;
        y.m_backend.data._M_elems[0x13] = 0;
        y.m_backend.data._M_elems[0x14] = 0;
        y.m_backend.data._M_elems[0x15] = 0;
        y.m_backend.data._M_elems[0x16] = 0;
        y.m_backend.data._M_elems[0x17] = 0;
        y.m_backend.data._M_elems[0x18] = 0;
        y.m_backend.data._M_elems[0x19] = 0;
        y.m_backend.data._M_elems._104_5_ = 0;
        y.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        y.m_backend.exp = 0;
        y.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&y.m_backend,&low[iVar2].m_backend,&vec[iVar2].m_backend);
        local_1b8.data._M_elems._0_8_ = local_1b8.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar3 = boost::multiprecision::operator>=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend,(int *)&local_1b8);
        pcVar9 = &pnVar11->m_backend;
        if (!tVar3) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&pnVar11->m_backend,&y.m_backend);
          pcVar9 = &result_1.m_backend;
        }
        local_2b8.fpclass = cpp_dec_float_finite;
        local_2b8.prec_elem = 0x1c;
        local_2b8.data._M_elems[0] = 0;
        local_2b8.data._M_elems[1] = 0;
        local_2b8.data._M_elems[2] = 0;
        local_2b8.data._M_elems[3] = 0;
        local_2b8.data._M_elems[4] = 0;
        local_2b8.data._M_elems[5] = 0;
        local_2b8.data._M_elems[6] = 0;
        local_2b8.data._M_elems[7] = 0;
        local_2b8.data._M_elems[8] = 0;
        local_2b8.data._M_elems[9] = 0;
        local_2b8.data._M_elems[10] = 0;
        local_2b8.data._M_elems[0xb] = 0;
        local_2b8.data._M_elems[0xc] = 0;
        local_2b8.data._M_elems[0xd] = 0;
        local_2b8.data._M_elems[0xe] = 0;
        local_2b8.data._M_elems[0xf] = 0;
        local_2b8.data._M_elems[0x10] = 0;
        local_2b8.data._M_elems[0x11] = 0;
        local_2b8.data._M_elems[0x12] = 0;
        local_2b8.data._M_elems[0x13] = 0;
        local_2b8.data._M_elems[0x14] = 0;
        local_2b8.data._M_elems[0x15] = 0;
        local_2b8.data._M_elems[0x16] = 0;
        local_2b8.data._M_elems[0x17] = 0;
        local_2b8.data._M_elems[0x18] = 0;
        local_2b8.data._M_elems[0x19] = 0;
        local_2b8.data._M_elems._104_5_ = 0;
        local_2b8.data._M_elems[0x1b]._1_3_ = 0;
        local_2b8.exp = 0;
        local_2b8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_2b8,pcVar9,&local_b0);
        lVar5 = 0x1c;
        pcVar9 = &local_2b8;
        pnVar10 = &local_3b8;
        for (lVar6 = lVar5; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pnVar10->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar14 * -8 + 4);
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + (ulong)bVar14 * -8 + 4);
        }
        local_3b8.m_backend.exp = local_2b8.exp;
        local_3b8.m_backend.neg = local_2b8.neg;
        local_3b8.m_backend.fpclass = local_2b8.fpclass;
        local_3b8.m_backend.prec_elem = local_2b8.prec_elem;
        pBVar13 = (this_00->data).
                  super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar13[*nBp].idx = iVar2;
        iVar2 = *nBp;
        pBVar13[iVar2].src = src;
        pnVar10 = &local_3b8;
        pBVar7 = pBVar13 + iVar2;
        for (; lVar5 != 0; lVar5 = lVar5 + -1) {
          *(uint *)&(pBVar7->val).m_backend = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar10 + (ulong)bVar14 * -8 + 4);
          pBVar7 = (pointer)((long)pBVar7 + ((ulong)bVar14 * -2 + 1) * 4);
        }
        *(int *)((long)&pBVar13[iVar2].val.m_backend + 0x70) = local_2b8.exp;
        *(bool *)((long)&pBVar13[iVar2].val.m_backend + 0x74) = local_2b8.neg;
        *(undefined8 *)((long)&pBVar13[iVar2].val.m_backend + 0x78) = local_2b8._120_8_;
LAB_004597f6:
        local_3b8.m_backend.exp = local_2b8.exp;
        local_3b8.m_backend.neg = local_2b8.neg;
        local_3b8.m_backend._120_8_ = local_2b8._120_8_;
        tVar3 = boost::multiprecision::operator<(&local_3b8,&local_130);
        iVar2 = *nBp;
        if (tVar3) {
          pnVar10 = &local_3b8;
          pnVar8 = &local_130;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pnVar8->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + (ulong)bVar14 * -8 + 4);
            pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar8 + ((ulong)bVar14 * -2 + 1) * 4);
          }
          local_130.m_backend.exp = local_3b8.m_backend.exp;
          local_130.m_backend.neg = local_3b8.m_backend.neg;
          local_130.m_backend.fpclass = local_3b8.m_backend.fpclass;
          local_130.m_backend.prec_elem = local_3b8.m_backend.prec_elem;
          *local_3d8 = iVar2;
        }
        *nBp = iVar2 + 1;
      }
    }
    else {
      for (; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + (ulong)bVar14 * -8 + 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar14 * -8 + 4);
      }
      y.m_backend.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      y.m_backend.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      y.m_backend.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      y.m_backend.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (y.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0) {
        y.m_backend.neg = (bool)(y.m_backend.neg ^ 1);
      }
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&y.m_backend);
      if (tVar3) {
        pdVar4 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar4,(type *)0x0);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&upp[iVar2].m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar3) {
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x1c;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems[0xe] = 0;
          y.m_backend.data._M_elems[0xf] = 0;
          y.m_backend.data._M_elems[0x10] = 0;
          y.m_backend.data._M_elems[0x11] = 0;
          y.m_backend.data._M_elems[0x12] = 0;
          y.m_backend.data._M_elems[0x13] = 0;
          y.m_backend.data._M_elems[0x14] = 0;
          y.m_backend.data._M_elems[0x15] = 0;
          y.m_backend.data._M_elems[0x16] = 0;
          y.m_backend.data._M_elems[0x17] = 0;
          y.m_backend.data._M_elems[0x18] = 0;
          y.m_backend.data._M_elems[0x19] = 0;
          y.m_backend.data._M_elems._104_5_ = 0;
          y.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&y.m_backend,&upp[iVar2].m_backend,&vec[iVar2].m_backend);
          local_3dc = 0;
          tVar3 = boost::multiprecision::operator<=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,&local_3dc);
          if (tVar3) {
            pnVar10 = pnVar11;
            pcVar9 = &result_1.m_backend;
            for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
              (pcVar9->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
              pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar10 + (ulong)bVar14 * -8 + 4);
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar14 * -8 + 4);
            }
            result_1.m_backend.exp =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.exp;
            result_1.m_backend.neg =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.neg;
            result_1.m_backend.fpclass =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.fpclass;
            result_1.m_backend.prec_elem =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.prec_elem;
            if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
                result_1.m_backend.data._M_elems[0] != 0) {
LAB_004596d9:
            }
          }
          else {
            local_1b8.fpclass = cpp_dec_float_finite;
            local_1b8.prec_elem = 0x1c;
            local_1b8.data._M_elems[0] = 0;
            local_1b8.data._M_elems[1] = 0;
            local_1b8.data._M_elems[2] = 0;
            local_1b8.data._M_elems[3] = 0;
            local_1b8.data._M_elems[4] = 0;
            local_1b8.data._M_elems[5] = 0;
            local_1b8.data._M_elems[6] = 0;
            local_1b8.data._M_elems[7] = 0;
            local_1b8.data._M_elems[8] = 0;
            local_1b8.data._M_elems[9] = 0;
            local_1b8.data._M_elems[10] = 0;
            local_1b8.data._M_elems[0xb] = 0;
            local_1b8.data._M_elems[0xc] = 0;
            local_1b8.data._M_elems[0xd] = 0;
            local_1b8.data._M_elems[0xe] = 0;
            local_1b8.data._M_elems[0xf] = 0;
            local_1b8.data._M_elems[0x10] = 0;
            local_1b8.data._M_elems[0x11] = 0;
            local_1b8.data._M_elems[0x12] = 0;
            local_1b8.data._M_elems[0x13] = 0;
            local_1b8.data._M_elems[0x14] = 0;
            local_1b8.data._M_elems[0x15] = 0;
            local_1b8.data._M_elems[0x16] = 0;
            local_1b8.data._M_elems[0x17] = 0;
            local_1b8.data._M_elems[0x18] = 0;
            local_1b8.data._M_elems[0x19] = 0;
            local_1b8.data._M_elems._104_5_ = 0;
            local_1b8.data._M_elems[0x1b]._1_3_ = 0;
            local_1b8.exp = 0;
            local_1b8.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&local_1b8,&y.m_backend,&pnVar11->m_backend);
            pcVar9 = &local_1b8;
            pcVar12 = &result_1.m_backend;
            for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
              (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar14 * -8 + 4);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar14 * -8 + 4);
            }
            result_1.m_backend.exp = local_1b8.exp;
            result_1.m_backend.neg = local_1b8.neg;
            result_1.m_backend.fpclass = local_1b8.fpclass;
            result_1.m_backend.prec_elem = local_1b8.prec_elem;
            if (local_1b8.fpclass != cpp_dec_float_finite ||
                result_1.m_backend.data._M_elems[0] != 0) goto LAB_004596d9;
          }
          local_2b8.fpclass = cpp_dec_float_finite;
          local_2b8.prec_elem = 0x1c;
          local_2b8.data._M_elems[0] = 0;
          local_2b8.data._M_elems[1] = 0;
          local_2b8.data._M_elems[2] = 0;
          local_2b8.data._M_elems[3] = 0;
          local_2b8.data._M_elems[4] = 0;
          local_2b8.data._M_elems[5] = 0;
          local_2b8.data._M_elems[6] = 0;
          local_2b8.data._M_elems[7] = 0;
          local_2b8.data._M_elems[8] = 0;
          local_2b8.data._M_elems[9] = 0;
          local_2b8.data._M_elems[10] = 0;
          local_2b8.data._M_elems[0xb] = 0;
          local_2b8.data._M_elems[0xc] = 0;
          local_2b8.data._M_elems[0xd] = 0;
          local_2b8.data._M_elems[0xe] = 0;
          local_2b8.data._M_elems[0xf] = 0;
          local_2b8.data._M_elems[0x10] = 0;
          local_2b8.data._M_elems[0x11] = 0;
          local_2b8.data._M_elems[0x12] = 0;
          local_2b8.data._M_elems[0x13] = 0;
          local_2b8.data._M_elems[0x14] = 0;
          local_2b8.data._M_elems[0x15] = 0;
          local_2b8.data._M_elems[0x16] = 0;
          local_2b8.data._M_elems[0x17] = 0;
          local_2b8.data._M_elems[0x18] = 0;
          local_2b8.data._M_elems[0x19] = 0;
          local_2b8.data._M_elems._104_5_ = 0;
          local_2b8.data._M_elems[0x1b]._1_3_ = 0;
          local_2b8.exp = 0;
          local_2b8.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2b8,&result_1.m_backend,&local_b0);
          lVar6 = 0x1c;
          pcVar9 = &local_2b8;
          pnVar10 = &local_3b8;
          for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pnVar10->m_backend).data._M_elems[0] = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar14 * -8 + 4);
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + (ulong)bVar14 * -8 + 4);
          }
          local_3b8.m_backend.exp = local_2b8.exp;
          local_3b8.m_backend.neg = local_2b8.neg;
          local_3b8.m_backend.fpclass = local_2b8.fpclass;
          local_3b8.m_backend.prec_elem = local_2b8.prec_elem;
          pBVar13 = (this_00->data).
                    super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar13[*nBp].idx = iVar2;
          iVar2 = *nBp;
          pBVar13[iVar2].src = src;
          pnVar10 = &local_3b8;
          pBVar7 = pBVar13 + iVar2;
          for (; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(uint *)&(pBVar7->val).m_backend = (pnVar10->m_backend).data._M_elems[0];
            pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar10 + (ulong)bVar14 * -8 + 4);
            pBVar7 = (pointer)((long)pBVar7 + ((ulong)bVar14 * -2 + 1) * 4);
          }
          *(int *)((long)&pBVar13[iVar2].val.m_backend + 0x70) = local_2b8.exp;
          *(bool *)((long)&pBVar13[iVar2].val.m_backend + 0x74) = local_2b8.neg;
          *(undefined8 *)((long)&pBVar13[iVar2].val.m_backend + 0x78) = local_2b8._120_8_;
          goto LAB_004597f6;
        }
      }
    }
    if ((int)(((long)(this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->breakpoints).data.
                    super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x88) <= *nBp) {
      Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
      ::reSize(this_00,*nBp * 2);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMin(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];

            curVal = (y >= 0) ? this->fastDelta / x : (this->fastDelta - y) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? -this->fastDelta / x : -(y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}